

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::WeakCrossingSIVTest
          (LoopDependenceAnalysis *this,SENode *source,SENode *destination,SENode *coefficient,
          DistanceEntry *distance_entry)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SENode *pSVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar6;
  char *__s;
  string *debug_msg;
  float fVar7;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Performing WeakCrossingSIVTest.",&local_111);
  PrintDebug(this,&local_50);
  std::__cxx11::string::_M_dispose();
  iVar3 = (*source->_vptr_SENode[6])(source);
  if ((CONCAT44(extraout_var,iVar3) == 0) ||
     (iVar3 = (*destination->_vptr_SENode[6])(destination), CONCAT44(extraout_var_00,iVar3) == 0)) {
    __s = "WeakCrossingSIVTest found source or destination != SERecurrentNode. Exiting";
    debug_msg = &local_70;
  }
  else {
    iVar3 = (*destination->_vptr_SENode[6])(destination);
    pSVar5 = *(SENode **)(CONCAT44(extraout_var_01,iVar3) + 0x38);
    iVar3 = (*source->_vptr_SENode[6])(source);
    pSVar5 = ScalarEvolutionAnalysis::CreateSubtraction
                       (&this->scalar_evolution_,pSVar5,
                        *(SENode **)(CONCAT44(extraout_var_02,iVar3) + 0x38));
    pSVar5 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar5);
    iVar3 = (*pSVar5->_vptr_SENode[4])(pSVar5);
    iVar4 = (*coefficient->_vptr_SENode[4])(coefficient);
    if (CONCAT44(extraout_var_04,iVar4) == 0 || CONCAT44(extraout_var_03,iVar3) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,
                 "WeakCrossingSIVTest was unable to fold offset_delta and coefficient to constants."
                 ,&local_111);
      PrintDebug(this,&local_f0);
      std::__cxx11::string::_M_dispose();
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,
                 "WeakCrossingSIVTest folding offset_delta and coefficient to constants.",&local_111
                );
      PrintDebug(this,&local_90);
      std::__cxx11::string::_M_dispose();
      lVar1 = *(long *)(CONCAT44(extraout_var_03,iVar3) + 0x30);
      lVar2 = *(long *)(CONCAT44(extraout_var_04,iVar4) + 0x30) * 2;
      lVar6 = lVar1 % lVar2;
      if ((lVar6 != 0) && ((fVar7 = (float)lVar6 / (float)lVar2, fVar7 != 0.5 || (NAN(fVar7))))) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,
                   "WeakCrossingSIVTest proved independence through distance escaping the loop bounds."
                   ,&local_111);
        PrintDebug(this,&local_b0);
        std::__cxx11::string::_M_dispose();
        distance_entry->dependence_information = DIRECTION;
        distance_entry->direction = NONE;
        return true;
      }
      if (lVar1 / lVar2 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"WeakCrossingSIVTest found EQ dependence.",&local_111);
        PrintDebug(this,&local_d0);
        std::__cxx11::string::_M_dispose();
        distance_entry->dependence_information = DISTANCE;
        distance_entry->direction = EQ;
        distance_entry->distance = 0;
        return false;
      }
    }
    __s = "WeakCrossingSIVTest was unable to determine any dependence information.";
    debug_msg = &local_110;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)debug_msg,__s,&local_111);
  PrintDebug(this,debug_msg);
  std::__cxx11::string::_M_dispose();
  distance_entry->direction = ALL;
  return false;
}

Assistant:

bool LoopDependenceAnalysis::WeakCrossingSIVTest(
    SENode* source, SENode* destination, SENode* coefficient,
    DistanceEntry* distance_entry) {
  PrintDebug("Performing WeakCrossingSIVTest.");
  // We currently can't handle symbolic WeakCrossingSIVTests. If either source
  // or destination are not SERecurrentNodes we must exit.
  if (!source->AsSERecurrentNode() || !destination->AsSERecurrentNode()) {
    PrintDebug(
        "WeakCrossingSIVTest found source or destination != SERecurrentNode. "
        "Exiting");
    distance_entry->direction = DistanceEntry::Directions::ALL;
    return false;
  }

  // Build an SENode for distance.
  SENode* offset_delta =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateSubtraction(
          destination->AsSERecurrentNode()->GetOffset(),
          source->AsSERecurrentNode()->GetOffset()));

  // Scalar evolution doesn't perform division, so we must fold to constants and
  // do it manually.
  int64_t distance = 0;
  SEConstantNode* delta_constant = offset_delta->AsSEConstantNode();
  SEConstantNode* coefficient_constant = coefficient->AsSEConstantNode();
  if (delta_constant && coefficient_constant) {
    PrintDebug(
        "WeakCrossingSIVTest folding offset_delta and coefficient to "
        "constants.");
    int64_t delta_value = delta_constant->FoldToSingleValue();
    int64_t coefficient_value = coefficient_constant->FoldToSingleValue();
    // Check if the distance is not integral or if it has a non-integral part
    // equal to 1/2.
    if (delta_value % (2 * coefficient_value) != 0 &&
        static_cast<float>(delta_value % (2 * coefficient_value)) /
                static_cast<float>(2 * coefficient_value) !=
            0.5) {
      PrintDebug(
          "WeakCrossingSIVTest proved independence through distance escaping "
          "the loop bounds.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    } else {
      distance = delta_value / (2 * coefficient_value);
    }

    if (distance == 0) {
      PrintDebug("WeakCrossingSIVTest found EQ dependence.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DISTANCE;
      distance_entry->direction = DistanceEntry::Directions::EQ;
      distance_entry->distance = 0;
      return false;
    }
  } else {
    PrintDebug(
        "WeakCrossingSIVTest was unable to fold offset_delta and coefficient "
        "to constants.");
  }

  // We were unable to prove independence or discern any additional information.
  // Must assume <=> direction.
  PrintDebug(
      "WeakCrossingSIVTest was unable to determine any dependence "
      "information.");
  distance_entry->direction = DistanceEntry::Directions::ALL;
  return false;
}